

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  bool bVar1;
  long lVar2;
  byte *pbVar3;
  size_type sVar4;
  byte *pbVar5;
  string regex_str;
  RegularExpression regex;
  
  lVar2 = std::__cxx11::string::find((string *)have,(ulong)want);
  if (lVar2 == -1) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    std::__cxx11::string::string((string *)&regex_str,"(^|:)(",(allocator *)&regex);
    pbVar3 = (byte *)(want->_M_dataplus)._M_p;
    for (pbVar5 = pbVar3; pbVar5 != pbVar3 + want->_M_string_length; pbVar5 = pbVar5 + 1) {
      if ((9 < (byte)(*pbVar5 - 0x30)) && (0x19 < (byte)((*pbVar5 & 0xdf) + 0xbf))) {
        std::__cxx11::string::append((char *)&regex_str);
      }
      std::__cxx11::string::append((ulong)&regex_str,'\x01');
      pbVar3 = (byte *)(want->_M_dataplus)._M_p;
    }
    std::__cxx11::string::append((char *)&regex_str);
    cmsys::RegularExpression::RegularExpression(&regex,regex_str._M_dataplus._M_p);
    bVar1 = cmsys::RegularExpression::find(&regex,have);
    sVar4 = 0xffffffffffffffff;
    if (bVar1) {
      sVar4 = (long)regex.startp[2] - (long)regex.searchstring;
    }
    cmsys::RegularExpression::~RegularExpression(&regex);
    std::__cxx11::string::~string((string *)&regex_str);
  }
  return sVar4;
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  // Search for the desired rpath.
  std::string::size_type pos = have.find(want);

  // If the path is not present we are done.
  if(pos == std::string::npos)
    {
    return pos;
    }

  // Build a regex to match a properly separated path instance.
  std::string regex_str = "(^|:)(";
  for(std::string::const_iterator i = want.begin(); i != want.end(); ++i)
    {
    int ch = *i;
    if(!(('a' <= ch && ch <= 'z') ||
         ('A' <= ch && ch <= 'Z') ||
         ('0' <= ch && ch <= '9')))
      {
      // Escape the non-alphanumeric character.
      regex_str += "\\";
      }
    // Store the character.
    regex_str.append(1, static_cast<char>(ch));
    }
  regex_str += ")(:|$)";

  // Look for the separated path.
  cmsys::RegularExpression regex(regex_str.c_str());
  if(regex.find(have))
    {
    // Return the position of the path portion.
    return regex.start(2);
    }
  else
    {
    // The desired rpath was not found.
    return std::string::npos;
    }
}